

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void dump_fnobj(LispPTR index)

{
  LispPTR *local_20;
  LispPTR *defcell68k;
  LispPTR index_local;
  
  if ((index & 0xfff0000) == 0) {
    local_20 = (LispPTR *)(AtomSpace + (ulong)(index * 5) * 2);
  }
  else {
    local_20 = NativeAligned4FromLAddr(index);
  }
  local_20 = local_20 + 2;
  dump_fnbody(*local_20);
  return;
}

Assistant:

void dump_fnobj(LispPTR index)
/* atom index */
{
  LispPTR *defcell68k;

  defcell68k = GetDEFCELL68k(index);
  dump_fnbody(*defcell68k);

}